

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiAreaPrivate::_q_moveTab(QMdiAreaPrivate *this,int from,int to)

{
  long lVar1;
  long lVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  int iVar6;
  long in_RCX;
  long lVar7;
  QObject *mdiChild;
  
  QList<QPointer<QMdiSubWindow>_>::move(&this->childWindows,(long)from,(long)to);
  qVar5 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QPointer<QMdiSubWindow>>
                    (&this->childWindows,&this->active,0);
  if ((int)qVar5 == -1) {
    return;
  }
  lVar2 = (this->indicesToActivatedChildren).d.size;
  if (lVar2 != 0) {
    lVar7 = -4;
    do {
      iVar6 = (int)in_RCX;
      lVar1 = lVar2 * -4 + lVar7;
      if (lVar1 == -4) goto LAB_00447dcb;
      in_RCX = lVar7 + 4;
      lVar4 = lVar7 + 4;
      lVar7 = in_RCX;
    } while (*(int *)((long)(this->indicesToActivatedChildren).d.ptr + lVar4) != (int)qVar5);
    iVar6 = (int)(in_RCX >> 2);
LAB_00447dcb:
    if (lVar1 != -4) goto LAB_00447dd8;
  }
  iVar6 = -1;
LAB_00447dd8:
  if (iVar6 == 0) {
    return;
  }
  mdiChild = (QObject *)0x0;
  QList<int>::move(&this->indicesToActivatedChildren,(long)iVar6,0);
  pDVar3 = (this->active).wp.d;
  if (pDVar3 != (Data *)0x0) {
    if (*(int *)(pDVar3 + 4) == 0) {
      mdiChild = (QObject *)0x0;
    }
    else {
      mdiChild = (this->active).wp.value;
    }
  }
  internalRaise(this,(QMdiSubWindow *)mdiChild);
  return;
}

Assistant:

void QMdiAreaPrivate::_q_moveTab(int from, int to)
{
#if !QT_CONFIG(tabbar)
    Q_UNUSED(from);
    Q_UNUSED(to);
#else
    childWindows.move(from, to);

    // Put the active window in front to update activation order.
    const int indexToActiveWindow = childWindows.indexOf(active);
    if (indexToActiveWindow != -1) {
        const int index = indicesToActivatedChildren.indexOf(indexToActiveWindow);
        Q_ASSERT(index != -1);
        if (index != 0) { // if it's not in front
            indicesToActivatedChildren.move(index, 0);
            internalRaise(active);
        }
    }
#endif // QT_CONFIG(tabbar)
}